

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O0

string * __thiscall
OpenMPAlignedClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPAlignedClause *this)

{
  bool bVar1;
  string local_b8;
  string local_98;
  string local_78;
  allocator<char> local_51;
  string local_50 [8];
  string clause_string;
  allocator<char> local_1a;
  byte local_19;
  OpenMPAlignedClause *local_18;
  OpenMPAlignedClause *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (OpenMPAlignedClause *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"aligned ",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"(",&local_51);
  std::allocator<char>::~allocator(&local_51);
  OpenMPClause::expressionToString_abi_cxx11_(&local_78,&this->super_OpenMPClause);
  std::__cxx11::string::operator+=(local_50,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  getUserDefinedAlignment_abi_cxx11_(&local_98,this);
  bVar1 = std::operator!=(&local_98,"");
  std::__cxx11::string::~string((string *)&local_98);
  if (bVar1) {
    std::__cxx11::string::operator+=(local_50,":");
    getUserDefinedAlignment_abi_cxx11_(&local_b8,this);
    std::__cxx11::string::operator+=(local_50,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  std::__cxx11::string::operator+=(local_50,") ");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_50);
  local_19 = 1;
  std::__cxx11::string::~string(local_50);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPAlignedClause::toString() {

    std::string result = "aligned ";
    std::string clause_string = "(";
    clause_string += this->expressionToString();
    if(this->getUserDefinedAlignment() != ""){
        clause_string += ":";
        clause_string += this->getUserDefinedAlignment();
    }
        clause_string += ") ";
        result += clause_string;
    return result;
}